

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton10.cpp
# Opt level: O0

void __thiscall CDReporter<ComponentE>::~CDReporter(CDReporter<ComponentE> *this)

{
  ostream *poVar1;
  void *this_00;
  void *in_RDI;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"destructor: ");
  poVar1 = std::operator<<(poVar1,"CDReporter<ComponentE>::~CDReporter() [T = ComponentE]");
  poVar1 = std::operator<<(poVar1," this: ");
  this_00 = (void *)std::ostream::operator<<(poVar1,in_RDI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

~CDReporter() { std::cout << "destructor: " << __PRETTY_FUNCTION__ << " this: " << (void*)this << std::endl; }